

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O3

Extra_SymmInfo_t * Extra_SymmPairsComputeNaive(DdManager *dd,DdNode *bFunc)

{
  ulong uVar1;
  DdNode *pDVar2;
  int *piVar3;
  char **ppcVar4;
  uint nVars;
  int iVar5;
  DdNode *n;
  Extra_SymmInfo_t *pEVar6;
  DdHalfWord *pDVar7;
  DdNode *pDVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong local_50;
  
  n = Cudd_Support(dd,bFunc);
  Cudd_Ref(n);
  nVars = Extra_bddSuppSize(dd,n);
  pEVar6 = Extra_SymmPairsAllocate(nVars);
  pEVar6->nVarsMax = dd->size;
  pDVar2 = dd->one;
  if (n != pDVar2) {
    pDVar7 = (DdHalfWord *)pEVar6->pVars;
    pDVar8 = n;
    do {
      *pDVar7 = pDVar8->index;
      pDVar8 = (pDVar8->type).kids.T;
      pDVar7 = pDVar7 + 1;
    } while (pDVar8 != pDVar2);
  }
  if (0 < (int)nVars) {
    uVar9 = (ulong)nVars;
    local_50 = 1;
    uVar11 = 0;
    do {
      uVar1 = uVar11 + 1;
      if (uVar1 < uVar9) {
        piVar3 = pEVar6->pVars;
        uVar10 = local_50;
        do {
          iVar5 = Extra_bddCheckVarsSymmetricNaive(dd,bFunc,piVar3[uVar11],piVar3[uVar10]);
          ppcVar4 = pEVar6->pSymms;
          ppcVar4[uVar11][uVar10] = (char)iVar5;
          ppcVar4[uVar10][uVar11] = (char)iVar5;
          if (ppcVar4[uVar11][uVar10] != '\0') {
            pEVar6->nSymms = pEVar6->nSymms + 1;
          }
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      local_50 = local_50 + 1;
      uVar11 = uVar1;
    } while (uVar1 != uVar9);
  }
  Cudd_RecursiveDeref(dd,n);
  return pEVar6;
}

Assistant:

Extra_SymmInfo_t * Extra_SymmPairsComputeNaive( DdManager * dd, DdNode * bFunc )
{
    DdNode * bSupp, * bTemp;
    int nSuppSize;
    Extra_SymmInfo_t * p;
    int i, k;

    // compute the support
    bSupp = Cudd_Support( dd, bFunc );   Cudd_Ref( bSupp );
    nSuppSize = Extra_bddSuppSize( dd, bSupp );
//printf( "Support = %d. ", nSuppSize );
//Extra_bddPrint( dd, bSupp );
//printf( "%d ", nSuppSize );

    // allocate the storage for symmetry info
    p = Extra_SymmPairsAllocate( nSuppSize );

    // assign the variables
    p->nVarsMax = dd->size;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
        p->pVars[i] = bTemp->index;

    // go through the candidate pairs and check using Idea1
    for ( i = 0; i < nSuppSize; i++ )
    for ( k = i+1; k < nSuppSize; k++ )
    {
        p->pSymms[k][i] = p->pSymms[i][k] = Extra_bddCheckVarsSymmetricNaive( dd, bFunc, p->pVars[i], p->pVars[k] );
        if ( p->pSymms[i][k] )
             p->nSymms++;
    }

    Cudd_RecursiveDeref( dd, bSupp );
    return p;

}